

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_huffman_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  uint uVar1;
  uint uVar2;
  cram_huffman_code *pcVar3;
  int iVar4;
  int iVar5;
  byte *__src;
  size_t __n;
  uchar *puVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  long lVar13;
  byte *pbVar14;
  byte bVar15;
  size_t sVar16;
  long lVar17;
  size_t __size;
  size_t sVar18;
  int32_t *piVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  byte bVar9;
  
  pcVar3 = (c->field_6).e_huffman.codes;
  __src = (byte *)malloc((long)(c->field_6).e_huffman.nvals * 6 + 0x10);
  if (__src == (byte *)0x0) {
    iVar4 = -1;
  }
  else {
    if (prefix == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = strlen(prefix);
      uVar7 = b->alloc;
      sVar18 = b->byte;
      if (uVar7 <= sVar18 + __n) {
        do {
          auVar20._8_4_ = (int)(uVar7 >> 0x20);
          auVar20._0_8_ = uVar7;
          auVar20._12_4_ = 0x45300000;
          dVar22 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
          uVar10 = (ulong)dVar22;
          sVar16 = (long)(dVar22 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
          if (uVar7 == 0) {
            sVar16 = 0x400;
          }
          b->alloc = sVar16;
          puVar6 = (uchar *)realloc(b->data,sVar16);
          b->data = puVar6;
          uVar7 = b->alloc;
          sVar18 = b->byte;
        } while (uVar7 <= sVar18 + __n);
      }
      memcpy(b->data + sVar18,prefix,__n);
      b->byte = b->byte + __n;
    }
    uVar1 = *(uint *)((long)&c->field_6 + 8);
    bVar11 = (byte)uVar1;
    bVar12 = (byte)(uVar1 >> 8);
    bVar8 = (byte)(uVar1 >> 0x10);
    bVar9 = (byte)(uVar1 >> 0x18);
    if ((ulong)uVar1 < 0x80) {
      *__src = bVar11;
      lVar13 = 1;
    }
    else if (uVar1 < 0x4000) {
      *__src = bVar12 | 0x80;
      __src[1] = bVar11;
      lVar13 = 2;
    }
    else if (uVar1 < 0x200000) {
      *__src = bVar8 | 0xc0;
      __src[1] = bVar12;
      __src[2] = bVar11;
      lVar13 = 3;
    }
    else if (uVar1 < 0x10000000) {
      *__src = bVar9 | 0xe0;
      __src[1] = bVar8;
      __src[2] = bVar12;
      __src[3] = bVar11;
      lVar13 = 4;
    }
    else {
      *__src = bVar9 >> 4 | 0xf0;
      __src[1] = (byte)(uVar1 >> 0x14);
      __src[2] = (byte)(uVar1 >> 0xc);
      __src[3] = (byte)(uVar1 >> 4);
      __src[4] = bVar11 & 0xf;
      lVar13 = 5;
    }
    pbVar14 = __src + lVar13;
    if (0 < (int)uVar1) {
      lVar13 = 0;
      do {
        uVar2 = *(uint *)((long)&pcVar3->symbol + lVar13);
        if (uVar2 < 0x80) {
          *pbVar14 = (byte)uVar2;
          lVar17 = 1;
        }
        else if (uVar2 < 0x4000) {
          *pbVar14 = (byte)(uVar2 >> 8) | 0x80;
          pbVar14[1] = *(byte *)((long)&pcVar3->symbol + lVar13);
          lVar17 = 2;
        }
        else if (uVar2 < 0x200000) {
          *pbVar14 = (byte)(uVar2 >> 0x10) | 0xc0;
          pbVar14[1] = *(byte *)((long)&pcVar3->symbol + lVar13 + 1);
          pbVar14[2] = *(byte *)((long)&pcVar3->symbol + lVar13);
          lVar17 = 3;
        }
        else {
          bVar15 = (byte)(uVar2 >> 0x18);
          if (uVar2 < 0x10000000) {
            *pbVar14 = bVar15 | 0xe0;
            pbVar14[1] = *(byte *)((long)&pcVar3->symbol + lVar13 + 2);
            pbVar14[2] = *(byte *)((long)&pcVar3->symbol + lVar13 + 1);
            pbVar14[3] = *(byte *)((long)&pcVar3->symbol + lVar13);
            lVar17 = 4;
          }
          else {
            *pbVar14 = bVar15 >> 4 | 0xf0;
            pbVar14[1] = (byte)(*(uint *)((long)&pcVar3->symbol + lVar13) >> 0x14);
            pbVar14[2] = (byte)(*(uint *)((long)&pcVar3->symbol + lVar13) >> 0xc);
            pbVar14[3] = (byte)(*(uint *)((long)&pcVar3->symbol + lVar13) >> 4);
            pbVar14[4] = *(byte *)((long)&pcVar3->symbol + lVar13) & 0xf;
            lVar17 = 5;
          }
        }
        pbVar14 = pbVar14 + lVar17;
        lVar13 = lVar13 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar13);
    }
    if (uVar1 < 0x80) {
      *pbVar14 = bVar11;
      lVar13 = 1;
    }
    else if (uVar1 < 0x4000) {
      *pbVar14 = bVar12 | 0x80;
      pbVar14[1] = bVar11;
      lVar13 = 2;
    }
    else if (uVar1 < 0x200000) {
      *pbVar14 = bVar8 | 0xc0;
      pbVar14[1] = bVar12;
      pbVar14[2] = bVar11;
      lVar13 = 3;
    }
    else if (uVar1 < 0x10000000) {
      *pbVar14 = bVar9 | 0xe0;
      pbVar14[1] = bVar8;
      pbVar14[2] = bVar12;
      pbVar14[3] = bVar11;
      lVar13 = 4;
    }
    else {
      *pbVar14 = bVar9 >> 4 | 0xf0;
      pbVar14[1] = (byte)(uVar1 >> 0x14);
      pbVar14[2] = (byte)(uVar1 >> 0xc);
      pbVar14[3] = (byte)(uVar1 >> 4);
      pbVar14[4] = bVar11 & 0xf;
      lVar13 = 5;
    }
    pbVar14 = pbVar14 + lVar13;
    if (0 < (c->field_6).e_huffman.nvals) {
      piVar19 = &pcVar3->len;
      lVar13 = 0;
      do {
        uVar1 = *piVar19;
        if (uVar1 < 0x80) {
          *pbVar14 = (byte)uVar1;
          lVar17 = 1;
        }
        else if (uVar1 < 0x4000) {
          *pbVar14 = (byte)(uVar1 >> 8) | 0x80;
          pbVar14[1] = (byte)*piVar19;
          lVar17 = 2;
        }
        else if (uVar1 < 0x200000) {
          *pbVar14 = (byte)(uVar1 >> 0x10) | 0xc0;
          pbVar14[1] = *(byte *)((long)piVar19 + 1);
          pbVar14[2] = (byte)*piVar19;
          lVar17 = 3;
        }
        else {
          bVar8 = (byte)(uVar1 >> 0x18);
          if (uVar1 < 0x10000000) {
            *pbVar14 = bVar8 | 0xe0;
            pbVar14[1] = *(byte *)((long)piVar19 + 2);
            pbVar14[2] = *(byte *)((long)piVar19 + 1);
            pbVar14[3] = (byte)*piVar19;
            lVar17 = 4;
          }
          else {
            *pbVar14 = bVar8 >> 4 | 0xf0;
            pbVar14[1] = (byte)((uint)*piVar19 >> 0x14);
            pbVar14[2] = (byte)((uint)*piVar19 >> 0xc);
            pbVar14[3] = (byte)((uint)*piVar19 >> 4);
            pbVar14[4] = (byte)*piVar19 & 0xf;
            lVar17 = 5;
          }
        }
        pbVar14 = pbVar14 + lVar17;
        lVar13 = lVar13 + 1;
        piVar19 = piVar19 + 4;
      } while (lVar13 < (c->field_6).e_huffman.nvals);
    }
    iVar4 = itf8_put_blk(b,c->codec);
    sVar16 = (long)pbVar14 - (long)__src;
    iVar5 = itf8_put_blk(b,(int)sVar16);
    uVar7 = b->alloc;
    sVar18 = b->byte;
    if (uVar7 <= sVar18 + sVar16) {
      do {
        auVar21._8_4_ = (int)(uVar7 >> 0x20);
        auVar21._0_8_ = uVar7;
        auVar21._12_4_ = 0x45300000;
        dVar22 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
        uVar10 = (ulong)dVar22;
        __size = (long)(dVar22 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
        if (uVar7 == 0) {
          __size = 0x400;
        }
        b->alloc = __size;
        puVar6 = (uchar *)realloc(b->data,__size);
        b->data = puVar6;
        uVar7 = b->alloc;
        sVar18 = b->byte;
      } while (uVar7 <= sVar18 + sVar16);
    }
    memcpy(b->data + sVar18,__src,sVar16);
    b->byte = b->byte + sVar16;
    iVar4 = iVar4 + iVar5 + (int)__n + (int)sVar16;
    free(__src);
  }
  return iVar4;
}

Assistant:

int cram_huffman_encode_store(cram_codec *c, cram_block *b, char *prefix,
			      int version) {
    int i, len = 0;
    cram_huffman_code *codes = c->e_huffman.codes;
    /*
     * Up to code length 127 means 2.5e+26 bytes of data required (worst
     * case huffman tree needs symbols with freqs matching the Fibonacci
     * series). So guaranteed 1 byte per code.
     *
     * Symbols themselves could be 5 bytes (eg -1 is 5 bytes in itf8).
     *
     * Therefore 6*ncodes + 5 + 5 + 1 + 5 is max memory
     */
    char *tmp = malloc(6*c->e_huffman.nvals+16);
    char *tp = tmp;

    if (!tmp)
	return -1;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].symbol);
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].len);
    }

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, tp-tmp);
    BLOCK_APPEND(b, tmp, tp-tmp);
    len += tp-tmp;

    free(tmp);

    return len;
}